

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chip8.cpp
# Opt level: O3

void __thiscall Chip8::Chip8::~Chip8(Chip8 *this)

{
  Audio *pAVar1;
  CPU *pCVar2;
  Memory *pMVar3;
  
  SDL_Quit();
  pAVar1 = (this->_audio)._M_t.
           super___uniq_ptr_impl<Chip8::Audio,_std::default_delete<Chip8::Audio>_>._M_t.
           super__Tuple_impl<0UL,_Chip8::Audio_*,_std::default_delete<Chip8::Audio>_>.
           super__Head_base<0UL,_Chip8::Audio_*,_false>._M_head_impl;
  if (pAVar1 != (Audio *)0x0) {
    operator_delete(pAVar1);
  }
  (this->_audio)._M_t.super___uniq_ptr_impl<Chip8::Audio,_std::default_delete<Chip8::Audio>_>._M_t.
  super__Tuple_impl<0UL,_Chip8::Audio_*,_std::default_delete<Chip8::Audio>_>.
  super__Head_base<0UL,_Chip8::Audio_*,_false>._M_head_impl = (Audio *)0x0;
  pCVar2 = (this->_cpu)._M_t.super___uniq_ptr_impl<Chip8::CPU,_std::default_delete<Chip8::CPU>_>.
           _M_t.super__Tuple_impl<0UL,_Chip8::CPU_*,_std::default_delete<Chip8::CPU>_>.
           super__Head_base<0UL,_Chip8::CPU_*,_false>._M_head_impl;
  if (pCVar2 != (CPU *)0x0) {
    operator_delete(pCVar2);
  }
  (this->_cpu)._M_t.super___uniq_ptr_impl<Chip8::CPU,_std::default_delete<Chip8::CPU>_>._M_t.
  super__Tuple_impl<0UL,_Chip8::CPU_*,_std::default_delete<Chip8::CPU>_>.
  super__Head_base<0UL,_Chip8::CPU_*,_false>._M_head_impl = (CPU *)0x0;
  pMVar3 = (this->_memory)._M_t.
           super___uniq_ptr_impl<Chip8::Memory,_std::default_delete<Chip8::Memory>_>._M_t.
           super__Tuple_impl<0UL,_Chip8::Memory_*,_std::default_delete<Chip8::Memory>_>.
           super__Head_base<0UL,_Chip8::Memory_*,_false>._M_head_impl;
  if (pMVar3 != (Memory *)0x0) {
    operator_delete(pMVar3);
  }
  (this->_memory)._M_t.super___uniq_ptr_impl<Chip8::Memory,_std::default_delete<Chip8::Memory>_>.
  _M_t.super__Tuple_impl<0UL,_Chip8::Memory_*,_std::default_delete<Chip8::Memory>_>.
  super__Head_base<0UL,_Chip8::Memory_*,_false>._M_head_impl = (Memory *)0x0;
  std::unique_ptr<Chip8::Graphics,_std::default_delete<Chip8::Graphics>_>::~unique_ptr
            (&this->_graphics);
  return;
}

Assistant:

Chip8::~Chip8() {
        SDL_Quit();
    }